

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TOperator __thiscall
glslang::HlslParseContext::mapAtomicOp
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,bool isImage)

{
  TOperator TVar1;
  TOperator TVar2;
  
  switch(op) {
  case EOpInterlockedAdd:
    TVar1 = EOpImageAtomicAdd;
    TVar2 = EOpAtomicAdd;
    break;
  case EOpInterlockedAnd:
    TVar1 = EOpImageAtomicAnd;
    TVar2 = EOpAtomicAnd;
    break;
  case EOpInterlockedCompareExchange:
    TVar1 = EOpImageAtomicCompSwap;
    TVar2 = EOpAtomicCompSwap;
    break;
  default:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown atomic operation","unknown op","");
    return EOpNull;
  case EOpInterlockedExchange:
    TVar1 = EOpImageAtomicExchange;
    TVar2 = EOpAtomicExchange;
    break;
  case EOpInterlockedMax:
    TVar1 = EOpImageAtomicMax;
    TVar2 = EOpAtomicMax;
    break;
  case EOpInterlockedMin:
    TVar1 = EOpImageAtomicMin;
    TVar2 = EOpAtomicMin;
    break;
  case EOpInterlockedOr:
    TVar1 = EOpImageAtomicOr;
    TVar2 = EOpAtomicOr;
    break;
  case EOpInterlockedXor:
    TVar1 = EOpImageAtomicXor;
    TVar2 = EOpAtomicXor;
  }
  if (isImage) {
    TVar2 = TVar1;
  }
  return TVar2;
}

Assistant:

TOperator HlslParseContext::mapAtomicOp(const TSourceLoc& loc, TOperator op, bool isImage)
{
    switch (op) {
    case EOpInterlockedAdd:             return isImage ? EOpImageAtomicAdd      : EOpAtomicAdd;
    case EOpInterlockedAnd:             return isImage ? EOpImageAtomicAnd      : EOpAtomicAnd;
    case EOpInterlockedCompareExchange: return isImage ? EOpImageAtomicCompSwap : EOpAtomicCompSwap;
    case EOpInterlockedMax:             return isImage ? EOpImageAtomicMax      : EOpAtomicMax;
    case EOpInterlockedMin:             return isImage ? EOpImageAtomicMin      : EOpAtomicMin;
    case EOpInterlockedOr:              return isImage ? EOpImageAtomicOr       : EOpAtomicOr;
    case EOpInterlockedXor:             return isImage ? EOpImageAtomicXor      : EOpAtomicXor;
    case EOpInterlockedExchange:        return isImage ? EOpImageAtomicExchange : EOpAtomicExchange;
    case EOpInterlockedCompareStore:  // TODO: ...
    default:
        error(loc, "unknown atomic operation", "unknown op", "");
        return EOpNull;
    }
}